

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentQLearner.cpp
# Opt level: O1

void __thiscall
AgentQLearner::AgentQLearner
          (AgentQLearner *this,PlanningUnitDecPOMDPDiscrete *pu,Index id,double initValue,
          double epsilon,double alpha,double gamma,ExplorationT exploration,double temp)

{
  size_t size1;
  size_type size2;
  double local_28;
  
  *(Index *)&this->field_0x88 = id;
  this->field_0x8c = 0;
  *(PlanningUnitDecPOMDPDiscrete **)&this->field_0x90 = pu;
  (this->super_AgentFullyObservable)._vptr_AgentFullyObservable = (_func_int **)0x5a8df0;
  *(undefined8 *)&this->field_0x80 = 0x5a8e58;
  size1 = PlanningUnitMADPDiscrete::GetNrStates(&pu->super_PlanningUnitMADPDiscrete);
  size2 = (**(code **)((long)*(pu->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  *(undefined ***)&(this->super_AgentFullyObservable).field_0x8 = &PTR___cxa_pure_virtual_0059e870;
  local_28 = initValue;
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            *)&(this->super_AgentFullyObservable).field_0x10,size1,size2,&local_28);
  *(undefined ***)&(this->super_AgentFullyObservable).field_0x8 = &PTR_Get_005cdfc0;
  this->_m_firstAgent = this;
  this->_m_selJaI = 0x7fffffff;
  this->_m_prevSI = 0x7fffffff;
  this->_m_alpha = alpha;
  this->_m_gamma = gamma;
  this->_m_initValue = initValue;
  this->_m_exploration = exploration;
  this->_m_epsilon = epsilon;
  this->_m_temp = temp;
  this->_m_t = 0;
  return;
}

Assistant:

AgentQLearner::AgentQLearner(const PlanningUnitDecPOMDPDiscrete *pu, Index id,
                             double initValue, double epsilon, double alpha, double gamma,
                             ExplorationT exploration, double temp) :
    AgentDecPOMDPDiscrete(pu, id),
    AgentFullyObservable(pu, id),
    _m_Q(pu->GetNrStates(),pu->GetNrJointActions(),initValue), // allocate Q table
    _m_firstAgent(this)
{
    _m_selJaI = INT_MAX;
    _m_prevSI = INT_MAX;
    _m_alpha = alpha;
    _m_gamma = gamma;
    _m_initValue = initValue;
    _m_exploration = exploration;
    _m_epsilon = epsilon;
    _m_temp = temp;
    _m_t = 0;
}